

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

void __thiscall deci::ast_identifier_t::ast_identifier_t(ast_identifier_t *this,string *value)

{
  pointer pcVar1;
  
  (this->super_ast_item_t).parent = (ast_item_t *)0x0;
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011e470;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

ast_identifier_t::ast_identifier_t(const std::string& value):value(value) {

  }